

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O2

bloom_type __thiscall
bloom_filter::hash_ap(bloom_filter *this,uchar *begin,size_t remaining_length,bloom_type hash)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  uchar *itr;
  uint *puVar6;
  size_t sVar7;
  uint uVar8;
  
  uVar3 = (ulong)hash;
  sVar7 = 0;
  for (sVar4 = remaining_length; uVar8 = (uint)uVar3, 7 < sVar4; sVar4 = sVar4 - 8) {
    piVar1 = (int *)(begin + sVar7);
    lVar2 = sVar7 + 4;
    sVar7 = sVar7 + 8;
    uVar3 = (ulong)~(((uint)(uVar3 >> 5) ^ *(uint *)(begin + lVar2)) + uVar8 * 0x800 ^ uVar8 << 7 ^
                     (int)(uVar3 >> 3) * *piVar1 ^ uVar8);
  }
  if (sVar7 == remaining_length) {
    return uVar8;
  }
  if (sVar4 < 4) {
    puVar6 = (uint *)(begin + sVar7);
    if (sVar7 - remaining_length == -1) {
      iVar5 = 0;
      goto LAB_00112821;
    }
    uVar8 = ~(((uint)(uVar3 >> 5) ^ (uint)(ushort)*puVar6) + uVar8 * 0x800 ^ uVar8);
    iVar5 = 1;
LAB_0011280a:
    sVar4 = sVar4 - 2;
    puVar6 = (uint *)((long)puVar6 + 2);
  }
  else {
    puVar6 = (uint *)((long)(begin + sVar7) + 4);
    uVar8 = ~(uVar8 ^ ((uint)(uVar3 >> 5) ^ *(uint *)(begin + sVar7)) + uVar8 * 0x800);
    sVar4 = (remaining_length - sVar7) - 4;
    if (1 < sVar4) {
      uVar8 = (uVar8 >> 3) * (uint)(ushort)*puVar6 ^ uVar8 << 7 ^ uVar8;
      iVar5 = 2;
      goto LAB_0011280a;
    }
    iVar5 = 1;
  }
  if (sVar4 == 0) {
    return uVar8;
  }
LAB_00112821:
  return iVar5 + uVar8 + (uVar8 * -0x5a5a5a5b ^ (uint)(byte)*puVar6);
}

Assistant:

inline bloom_type hash_ap(const unsigned char* begin, std::size_t remaining_length, bloom_type hash) const
   {
      const unsigned char* itr = begin;
      unsigned int loop        = 0;

      while (remaining_length >= 8)
      {
         const unsigned int& i1 = *(reinterpret_cast<const unsigned int*>(itr)); itr += sizeof(unsigned int);
         const unsigned int& i2 = *(reinterpret_cast<const unsigned int*>(itr)); itr += sizeof(unsigned int);

         hash ^= (hash <<  7) ^  i1 * (hash >> 3) ^
              (~((hash << 11) + (i2 ^ (hash >> 5))));

         remaining_length -= 8;
      }

      if (remaining_length)
      {
         if (remaining_length >= 4)
         {
            const unsigned int& i = *(reinterpret_cast<const unsigned int*>(itr));

            if (loop & 0x01)
               hash ^=    (hash <<  7) ^  i * (hash >> 3);
            else
               hash ^= (~((hash << 11) + (i ^ (hash >> 5))));

            ++loop;

            remaining_length -= 4;

            itr += sizeof(unsigned int);
         }

         if (remaining_length >= 2)
         {
            const unsigned short& i = *(reinterpret_cast<const unsigned short*>(itr));

            if (loop & 0x01)
               hash ^=    (hash <<  7) ^  i * (hash >> 3);
            else
               hash ^= (~((hash << 11) + (i ^ (hash >> 5))));

            ++loop;

            remaining_length -= 2;

            itr += sizeof(unsigned short);
         }

         if (remaining_length)
         {
            hash += ((*itr) ^ (hash * 0xA5A5A5A5)) + loop;
         }
      }

      return hash;
   }